

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sun.cpp
# Opt level: O0

double __thiscall ON_Sun::CImpl::TimeZone(CImpl *this)

{
  wchar_t *path_to_node;
  double dVar1;
  ON_XMLVariant local_200;
  ON_XMLVariant local_108;
  CImpl *local_10;
  CImpl *this_local;
  
  local_10 = this;
  path_to_node = XMLPath_Sun();
  ::ON_XMLVariant::ON_XMLVariant(&local_200,0.0);
  ON_InternalXMLImpl::GetParameter
            (&local_108,&this->super_ON_InternalXMLImpl,path_to_node,L"observer-timezone",&local_200
            );
  dVar1 = ::ON_XMLVariant::operator_cast_to_double(&local_108);
  ::ON_XMLVariant::~ON_XMLVariant(&local_108);
  ::ON_XMLVariant::~ON_XMLVariant(&local_200);
  return dVar1;
}

Assistant:

double ON_Sun::CImpl::TimeZone(void) const
{
  return GetParameter(XMLPath_Sun(), ON_RDK_SUN_OBSERVER_TIMEZONE, 0.0);
}